

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void hit_prog_essence_light(OBJ_DATA *obj,CHAR_DATA *ch,CHAR_DATA *victim,int damage)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int in_ECX;
  long in_RDX;
  __type_conflict2 _Var5;
  undefined1 in_stack_000012f2;
  undefined1 in_stack_000012f3;
  int in_stack_000012f4;
  int in_stack_000012f8;
  int in_stack_000012fc;
  CHAR_DATA *in_stack_00001300;
  CHAR_DATA *in_stack_00001308;
  int in_stack_00001328;
  int in_stack_00001330;
  char *in_stack_00001338;
  CHAR_DATA *in_stack_00003758;
  CHAR_DATA *in_stack_00003760;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar6;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int from;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  char *format;
  int local_24;
  int local_20 [2];
  long local_18;
  
  if (0 < in_ECX) {
    local_18 = in_RDX;
    bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (((bVar2) &&
        (uVar1 = *(ulong *)(local_18 + 0x180), _Var5 = std::pow<int,int>(0,0x66de39),
        (uVar1 & (long)_Var5) != 0)) ||
       (uVar1 = *(ulong *)(local_18 + 0x280), _Var5 = std::pow<int,int>(0,0x66de70),
       (uVar1 & (long)_Var5) != 0)) {
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act(in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      raw_kill(in_stack_00003760,in_stack_00003758);
    }
    else {
      bVar2 = is_good((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (bVar2) {
        if ((*(int *)(local_18 + 0x158) < (int)*(short *)(local_18 + 0x15c)) &&
           (iVar3 = number_percent(), iVar3 < 0x33)) {
          act(in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          act(in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          send_to_char(in_stack_ffffffffffffff90,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          local_20[0] = (int)*(short *)(local_18 + 0x15c);
          iVar3 = *(int *)(local_18 + 0x158);
          local_24 = dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          local_24 = iVar3 + local_24;
          piVar4 = std::min<int>(local_20,&local_24);
          *(int *)(local_18 + 0x158) = *piVar4;
        }
      }
      else {
        bVar2 = is_neutral((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        if (bVar2) {
          iVar3 = number_percent();
          if (iVar3 < 0x33) {
            act(in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
            act(in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
            dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
            damage_new(in_stack_00001308,in_stack_00001300,in_stack_000012fc,in_stack_000012f8,
                       in_stack_000012f4,(bool)in_stack_000012f3,(bool)in_stack_000012f2,
                       in_stack_00001328,in_stack_00001330,in_stack_00001338);
          }
        }
        else {
          act(in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          act(in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          act(in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          uVar6 = 0;
          from = 0;
          uVar7 = 1;
          format = "blinding fury";
          damage_new(in_stack_00001308,in_stack_00001300,in_stack_000012fc,in_stack_000012f8,
                     in_stack_000012f4,(bool)in_stack_000012f3,(bool)in_stack_000012f2,
                     in_stack_00001328,in_stack_00001330,in_stack_00001338);
          iVar3 = number_percent();
          if ((iVar3 < 0x15) &&
             (iVar3 = number_range(from,in_stack_ffffffffffffff7c), iVar3 == 1 || iVar3 == 2)) {
            act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,uVar7),
                (void *)CONCAT44(in_stack_ffffffffffffff84,from),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,uVar6),0);
            act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,uVar7),
                (void *)CONCAT44(in_stack_ffffffffffffff84,from),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,uVar6),0);
            LAG_CHAR((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff84,from),in_stack_ffffffffffffff7c
                    );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void hit_prog_essence_light(OBJ_DATA *obj, CHAR_DATA *ch, CHAR_DATA *victim, int damage)
{
	if (damage <= 0)
		return;

	if (!(is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD)) && !IS_SET(victim->form, FORM_UNDEAD))
	{
		if (is_good(victim))
		{
			if (victim->hit < victim->max_hit && number_percent() <= 50)
			{
				act("A pearly luminescence flows into $n's wounds.", victim, obj, ch, TO_ROOM);
				act("A pearly luminescence flows into your wounds.", victim, obj, ch, TO_CHAR);
				send_to_char("You feel healed!\n\r", victim);
				victim->hit = std::min((int)victim->max_hit, victim->hit + dice(8, 8));
			}
		}
		else if (is_neutral(victim))
		{
			if (number_percent() <= 50)
			{
				act("A reluctant light flickers in $n's hands and lashes out!", ch, obj, victim, TO_ROOM);
				act("A reluctant light flickers in your hands and lashes out!", ch, obj, victim, TO_CHAR);
				damage_new(ch, victim, dice(3, ch->level), TYPE_UNDEFINED, DAM_HOLY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "torrent of light");
			}
		}
		else
		{
			act("Waves of brilliant white light cascade from your hands, searing $n!", victim, obj, ch, TO_VICT);
			act("Waves of brilliant white light cascade from $N's hands, searing $n!", victim, obj, ch, TO_NOTVICT);
			act("Waves of brilliant white light cascade from $N's hands, searing you!", victim, obj, ch, TO_CHAR);
			damage_new(ch, victim, dice(ch->level, 5), TYPE_UNDEFINED, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "blinding fury");

			if (number_percent() <= 20)
			{
				switch (number_range(1, 4))
				{
					case 1:
					case 2:
						act("You reel in agony as the raw energy engulfs you!", victim, 0, ch, TO_CHAR);
						act("$n staggers as the raw energy engulfs $m!", victim, 0, ch, TO_ROOM);
						LAG_CHAR(victim, PULSE_VIOLENCE);
						break;
				}
			}
		}
	}
	else
	{
		act("$p erupts with an unfathomable radiance, engulfing $N!", ch, obj, victim, TO_CHAR);
		act("A blinding radiance billows forth from $n, engulfing $N!", ch, obj, victim, TO_NOTVICT);
		act("$N lets out a terrifying preternatural wail, and crumbles to dust!", ch, obj, victim, TO_ALL);
		raw_kill(ch, victim);
	}
}